

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitCloud.c
# Opt level: O1

void Kit_TruthCofSupports
               (Vec_Int_t *vBddDir,Vec_Int_t *vBddInv,int nVars,Vec_Int_t *vMemory,uint *puSupps)

{
  uint uVar1;
  int *piVar2;
  byte bVar3;
  int *piVar4;
  ulong uVar5;
  int *piVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  size_t sVar13;
  int *piVar14;
  size_t __size;
  long lVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  
  uVar10 = (long)nVars * 2;
  lVar12 = (long)vBddDir->nSize * uVar10;
  iVar11 = (int)lVar12;
  if ((vMemory->nSize < iVar11) && (vMemory->nCap < iVar11)) {
    sVar13 = lVar12 * 4;
    if (vMemory->pArray == (int *)0x0) {
      piVar4 = (int *)malloc(sVar13);
    }
    else {
      piVar4 = (int *)realloc(vMemory->pArray,sVar13);
    }
    vMemory->pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_005c635c;
    vMemory->nCap = iVar11;
  }
  piVar6 = vMemory->pArray;
  iVar11 = (int)uVar10;
  lVar12 = (long)iVar11;
  sVar13 = lVar12 * 4;
  piVar4 = (int *)0x0;
  memset(piVar6,0,sVar13);
  if (1 < vBddDir->nSize) {
    uVar5 = 1;
    if (1 < iVar11) {
      uVar5 = uVar10 & 0xffffffff;
    }
    piVar2 = vBddDir->pArray;
    lVar15 = 1;
    piVar14 = piVar6;
    do {
      piVar14 = piVar14 + lVar12;
      uVar1 = piVar2[lVar15];
      iVar7 = (~uVar1 | 0xffffffe0) + nVars;
      iVar17 = (uVar1 >> 0x11 & 0xfff) * iVar11;
      iVar16 = (uVar1 >> 5 & 0xfff) * iVar11;
      if (0 < nVars) {
        uVar19 = 0;
        do {
          piVar14[uVar19] =
               piVar6[(long)iVar17 + uVar19] | 1 << ((byte)iVar7 & 0x1f) |
               piVar6[(long)iVar16 + uVar19];
          uVar19 = uVar19 + 1;
        } while (uVar5 != uVar19);
      }
      lVar18 = (long)(iVar7 * 2);
      lVar9 = (long)(iVar7 * 2 + 1);
      if (piVar6[iVar17 + lVar18] != piVar6[iVar17 + lVar9]) {
        __assert_fail("pFan0[2*Var + 0] == pFan0[2*Var + 1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitCloud.c"
                      ,0x14f,
                      "void Kit_TruthCofSupports(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, unsigned int *)"
                     );
      }
      if (piVar6[iVar16 + lVar18] != piVar6[iVar16 + lVar9]) {
        __assert_fail("pFan1[2*Var + 0] == pFan1[2*Var + 1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitCloud.c"
                      ,0x150,
                      "void Kit_TruthCofSupports(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, unsigned int *)"
                     );
      }
      piVar4 = piVar6 + lVar15 * lVar12;
      piVar4[lVar18] = piVar6[iVar17 + lVar18];
      piVar4[lVar9] = piVar6[iVar16 + lVar18];
      lVar15 = lVar15 + 1;
    } while (lVar15 < vBddDir->nSize);
  }
  memcpy(puSupps,piVar4,sVar13);
  lVar15 = vBddInv->nSize * lVar12;
  iVar7 = (int)lVar15;
  if ((vMemory->nSize < iVar7) && (vMemory->nCap < iVar7)) {
    __size = lVar15 * 4;
    if (vMemory->pArray == (int *)0x0) {
      piVar6 = (int *)malloc(__size);
    }
    else {
      piVar6 = (int *)realloc(vMemory->pArray,__size);
    }
    vMemory->pArray = piVar6;
    if (piVar6 == (int *)0x0) {
LAB_005c635c:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vMemory->nCap = iVar7;
  }
  piVar6 = vMemory->pArray;
  memset(piVar6,0,sVar13);
  if (1 < vBddInv->nSize) {
    uVar5 = 1;
    if (1 < iVar11) {
      uVar5 = uVar10 & 0xffffffff;
    }
    piVar2 = vBddInv->pArray;
    lVar15 = 1;
    piVar14 = piVar6;
    do {
      piVar14 = piVar14 + lVar12;
      uVar1 = piVar2[lVar15];
      uVar8 = uVar1 & 0x1f;
      iVar16 = (uVar1 >> 0x11 & 0xfff) * iVar11;
      iVar7 = (uVar1 >> 5 & 0xfff) * iVar11;
      if (0 < nVars) {
        uVar19 = 0;
        do {
          piVar14[uVar19] =
               piVar6[(long)iVar16 + uVar19] | 1 << (sbyte)uVar8 | piVar6[(long)iVar7 + uVar19];
          uVar19 = uVar19 + 1;
        } while (uVar5 != uVar19);
      }
      uVar19 = (ulong)(uVar8 * 2 + 1);
      if (piVar6[(long)iVar16 + (ulong)uVar8 * 2] != piVar6[(long)iVar16 + uVar19]) {
        __assert_fail("pFan0[2*Var + 0] == pFan0[2*Var + 1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitCloud.c"
                      ,0x169,
                      "void Kit_TruthCofSupports(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, unsigned int *)"
                     );
      }
      if (piVar6[(long)iVar7 + (ulong)(uVar8 * 2)] != piVar6[(long)iVar7 + uVar19]) {
        __assert_fail("pFan1[2*Var + 0] == pFan1[2*Var + 1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitCloud.c"
                      ,0x16a,
                      "void Kit_TruthCofSupports(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, unsigned int *)"
                     );
      }
      piVar4 = piVar6 + lVar15 * lVar12;
      *(int *)((long)piVar4 + (ulong)(uVar8 << 3)) = piVar6[(long)iVar16 + (ulong)uVar8 * 2];
      piVar4[uVar19] = *(int *)((long)piVar6 + (ulong)(uVar8 << 3) + (long)iVar7 * 4);
      lVar15 = lVar15 + 1;
    } while (lVar15 < vBddInv->nSize);
  }
  if (0 < nVars) {
    uVar5 = 1;
    if (1 < iVar11) {
      uVar5 = uVar10 & 0xffffffff;
    }
    uVar10 = 0;
    do {
      if (uVar10 == 0x42) {
        __assert_fail("nBits <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                      ,0xe4,"unsigned int Kit_BitMask(int)");
      }
      bVar3 = (byte)(uVar10 >> 1);
      puSupps[uVar10] =
           ((piVar4[uVar10] ^ puSupps[uVar10]) >> (bVar3 & 0x1f)) << (bVar3 & 0x1f) ^
           puSupps[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  return;
}

Assistant:

void Kit_TruthCofSupports( Vec_Int_t * vBddDir, Vec_Int_t * vBddInv, int nVars, Vec_Int_t * vMemory, unsigned * puSupps )
{
    Kit_Mux_t Mux;
    unsigned * puSuppAll;
    unsigned * pThis = NULL; // Suppress "might be used uninitialized"
    unsigned * pFan0, * pFan1;
    int i, v, Var, Entry, nSupps;
    nSupps = 2 * nVars;

    // extend storage
    if ( Vec_IntSize( vMemory ) < nSupps * Vec_IntSize(vBddDir) )
        Vec_IntGrow( vMemory, nSupps * Vec_IntSize(vBddDir) );
    puSuppAll = (unsigned *)Vec_IntArray( vMemory );
    // clear storage for the const node
    memset( puSuppAll, 0, sizeof(unsigned) * nSupps );
    // compute supports from nodes
    Vec_IntForEachEntryStart( vBddDir, Entry, i, 1 )
    {
        Mux = Kit_Int2Mux(Entry);
        Var = nVars - 1 - Mux.v;
        pFan0 = puSuppAll + nSupps * Mux.e;
        pFan1 = puSuppAll + nSupps * Mux.t;
        pThis = puSuppAll + nSupps * i;
        for ( v = 0; v < nSupps; v++ )
            pThis[v] = pFan0[v] | pFan1[v] | (1<<Var);
        assert( pFan0[2*Var + 0] == pFan0[2*Var + 1] );
        assert( pFan1[2*Var + 0] == pFan1[2*Var + 1] );
        pThis[2*Var + 0] = pFan0[2*Var + 0];// | pFan0[2*Var + 1];
        pThis[2*Var + 1] = pFan1[2*Var + 0];// | pFan1[2*Var + 1];
    }
    // copy the result
    memcpy( puSupps, pThis, sizeof(unsigned) * nSupps );
    // compute the inverse

    // extend storage
    if ( Vec_IntSize( vMemory ) < nSupps * Vec_IntSize(vBddInv) )
        Vec_IntGrow( vMemory, nSupps * Vec_IntSize(vBddInv) );
    puSuppAll = (unsigned *)Vec_IntArray( vMemory );
    // clear storage for the const node
    memset( puSuppAll, 0, sizeof(unsigned) * nSupps );
    // compute supports from nodes
    Vec_IntForEachEntryStart( vBddInv, Entry, i, 1 )
    {
        Mux = Kit_Int2Mux(Entry);
//        Var = nVars - 1 - Mux.v;
        Var = Mux.v;
        pFan0 = puSuppAll + nSupps * Mux.e;
        pFan1 = puSuppAll + nSupps * Mux.t;
        pThis = puSuppAll + nSupps * i;
        for ( v = 0; v < nSupps; v++ )
            pThis[v] = pFan0[v] | pFan1[v] | (1<<Var);
        assert( pFan0[2*Var + 0] == pFan0[2*Var + 1] );
        assert( pFan1[2*Var + 0] == pFan1[2*Var + 1] );
        pThis[2*Var + 0] = pFan0[2*Var + 0];// | pFan0[2*Var + 1];
        pThis[2*Var + 1] = pFan1[2*Var + 0];// | pFan1[2*Var + 1];
    }

    // merge supports
    for ( Var = 0; Var < nSupps; Var++ )
        puSupps[Var] = (puSupps[Var] & Kit_BitMask(Var/2)) | (pThis[Var] & ~Kit_BitMask(Var/2));
}